

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O1

void __thiscall
r_exec::InputLessPGMOverlay::patch_tpl_code
          (InputLessPGMOverlay *this,uint16_t pgm_code_index,uint16_t ipgm_code_index)

{
  _Object *p_Var1;
  byte bVar2;
  char cVar3;
  uint16_t pgm_code_index_00;
  uint16_t ipgm_code_index_00;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  Atom local_34 [4];
  
  bVar2 = r_code::Atom::getAtomCount();
  if (bVar2 != 0) {
    uVar5 = (ulong)bVar2;
    uVar4 = (uint)ipgm_code_index;
    lVar6 = (ulong)pgm_code_index * 4;
    do {
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 4;
      cVar3 = r_code::Atom::getDescriptor();
      if (cVar3 == -0x7e) {
        r_code::Atom::IPGMPointer((ushort)local_34);
        r_code::Atom::operator=((this->super_Overlay).code + lVar6,local_34);
        r_code::Atom::~Atom(local_34);
      }
      else if (cVar3 == -0x7c) {
        pgm_code_index_00 = r_code::Atom::asIndex();
        p_Var1 = (((this->super_Overlay).controller)->view->object).object;
        (*p_Var1->_vptr__Object[4])(p_Var1,(ulong)(uVar4 & 0xffff));
        ipgm_code_index_00 = r_code::Atom::asIndex();
        patch_tpl_code(this,pgm_code_index_00,ipgm_code_index_00);
      }
      else if (cVar3 == -0x7d) {
        return;
      }
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void InputLessPGMOverlay::patch_tpl_code(uint16_t pgm_code_index, uint16_t ipgm_code_index)   // patch recursively : in pgm_code[index] with IPGM_PTRs until ::.
{
    uint16_t atom_count = code[pgm_code_index].getAtomCount();

    for (uint16_t j = 1; j <= atom_count; ++j) {
        switch (code[pgm_code_index + j].getDescriptor()) {
        case Atom::WILDCARD:
            code[pgm_code_index + j] = Atom::IPGMPointer(ipgm_code_index + j);
            break;

        case Atom::T_WILDCARD: // leave as is and stop patching.
            return;

        case Atom::I_PTR:
            patch_tpl_code(code[pgm_code_index + j].asIndex(), getObject()->code(ipgm_code_index + j).asIndex());
            break;

        default: // leave as is.
            break;
        }
    }
}